

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O1

bool __thiscall QMimeData::hasText(QMimeData *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  QArrayData *local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*(this->super_QObject)._vptr_QObject[0xc])();
  bVar2 = true;
  if ((char)iVar3 == '\0') {
    local_50 = (QArrayData *)0x0;
    iVar4 = (*(this->super_QObject)._vptr_QObject[0xc])(this);
    if ((char)iVar4 == '\0') {
      bVar2 = hasUrls(this);
    }
  }
  if (((char)iVar3 == '\0') && (local_50 != (QArrayData *)0x0)) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QMimeData::hasText() const
{
    return hasFormat(textPlainLiteral()) || hasFormat(textPlainUtf8Literal()) || hasUrls();
}